

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_recorder.h
# Opt level: O1

void __thiscall
absl::lts_20240722::profiling_internal::
SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo>::SampleRecorder
          (SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo> *this)

{
  (this->dropped_samples_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->size_estimate_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->max_samples_).super___atomic_base<unsigned_long>._M_i = 0x100000;
  (this->all_)._M_b._M_p = (__pointer_type)0x0;
  container_internal::HashtablezInfo::HashtablezInfo(&this->graveyard_);
  (this->dispose_)._M_b._M_p = (__pointer_type)0x0;
  absl::lts_20240722::Mutex::Lock();
  (this->graveyard_).super_Sample<absl::lts_20240722::container_internal::HashtablezInfo>.dead =
       &this->graveyard_;
  absl::lts_20240722::Mutex::Unlock();
  return;
}

Assistant:

SampleRecorder<T>::SampleRecorder()
    : dropped_samples_(0), size_estimate_(0), all_(nullptr), dispose_(nullptr) {
  absl::MutexLock l(&graveyard_.init_mu);
  graveyard_.dead = &graveyard_;
}